

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::PathIntegrator::Li
          (PathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurf)

{
  float fVar1;
  Vector3f *pVVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pLVar5;
  uintptr_t uVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  short sVar12;
  LightSampleContext LVar13;
  LightSampleContext LVar14;
  LightSampleContext LVar15;
  LightSampleContext LVar16;
  Vector3f wiRender;
  Vector3f wi;
  undefined1 auVar17 [16];
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined8 uVar32;
  int i;
  BxDFFlags BVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  uint uVar38;
  char cVar39;
  ulong uVar40;
  pointer pLVar41;
  ulong uVar42;
  DebugMLTSampler *this_00;
  long lVar43;
  ImageInfiniteLight *this_01;
  ExhaustiveLightSampler *pEVar44;
  DiffuseBxDF *this_02;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this_03;
  long in_FS_OFFSET;
  bool bVar45;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar51 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  float fVar55;
  Tuple2<pbrt::Point2,_float> u2;
  Float FVar56;
  undefined4 extraout_XMM0_Dc;
  SampledSpectrum ret;
  undefined1 auVar57 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar71 [56];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  Float extraout_XMM0_Db_05;
  Float extraout_XMM0_Dc_05;
  Float extraout_XMM0_Dd_05;
  undefined1 auVar70 [64];
  float fVar72;
  undefined4 uVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar80 [56];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  Float m;
  float fVar81;
  undefined1 auVar82 [64];
  undefined1 in_XMM5 [16];
  Vector3f w;
  Vector3f woRender;
  Vector3f woRender_00;
  SampledSpectrum SVar83;
  Float f;
  optional<pbrt::BSDFSample> bs;
  SampledSpectrum rrBeta;
  LightSampleContext prevIntrCtx;
  SampledSpectrum Le;
  BSDF bsdf;
  optional<pbrt::ShapeIntersection> si;
  undefined1 auVar84 [12];
  uint local_37c;
  float local_364;
  undefined8 local_360;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  ulong local_340;
  undefined1 local_338 [16];
  ulong local_320;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  SamplerHandle *local_2f0;
  Tuple3<pbrt::Vector3,_float> local_2e8;
  undefined4 uStack_2dc;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined1 local_2c0;
  char local_2bc;
  undefined1 local_2b8 [4];
  float afStack_2b4 [10];
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  undefined8 uStack_26c;
  undefined8 uStack_264;
  LightSampleContext local_258;
  undefined1 local_228 [16];
  ulong local_210;
  float local_204;
  float local_200;
  float local_1fc;
  undefined1 local_1f8 [4];
  float afStack_1f4 [5];
  VisibleSurface *local_1e0;
  SamplerHandle local_1d8;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_1d0;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_1c8;
  undefined1 local_1c0 [16];
  ulong *local_1b0;
  Float local_188;
  Float FStack_184;
  Float FStack_180;
  Float FStack_17c;
  Float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  bool *local_160;
  ScratchBuffer *local_158;
  PrimitiveHandle *local_150;
  undefined1 local_148 [16];
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_138;
  ulong local_38;
  undefined1 auVar85 [28];
  undefined1 auVar50 [64];
  undefined1 auVar52 [64];
  undefined1 auVar46 [16];
  undefined1 auVar65 [64];
  undefined1 extraout_var [60];
  undefined1 auVar76 [64];
  
  local_258.n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  local_258.ns.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  local_258.ns.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  local_258.ns.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = 0.0;
  local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = 0.0;
  local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = 0.0;
  local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = 0.0;
  local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = 0.0;
  local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high = 0.0;
  local_258.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  local_258.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  local_150 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_1fc = 0.5;
  local_200 = 0.33333334;
  fStack_310 = 1.0;
  local_318 = (undefined1  [8])0x3f8000003f800000;
  fStack_30c = 1.0;
  local_204 = 0.2;
  _local_308 = ZEXT816(0);
  local_148 = SUB6416(ZEXT464(0x3f800000),0);
  local_160 = &ray->hasDifferentials;
  local_210 = 0;
  local_37c = 0;
  uVar40 = 0;
  local_2f0 = sampler;
  local_1e0 = visibleSurf;
  local_158 = scratchBuffer;
  do {
    *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
    if (((local_150->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
      local_38 = 0;
      local_138._0_64_ = in_ZmmResult;
      local_138._64_64_ = in_ZmmResult;
      local_138._128_64_ = in_ZmmResult;
      local_138._192_64_ = in_ZmmResult;
    }
    else {
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_138.__align,local_150,&ray->super_Ray,
                 INFINITY);
    }
    uVar34 = (uint)uVar40;
    if ((char)local_38 == '\0') {
      pLVar41 = (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                infiniteLights.
                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                super__Vector_impl_data._M_start;
      pLVar5 = *(pointer *)
                ((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                        infiniteLights.
                        super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                        _M_impl.super__Vector_impl_data + 8);
      bVar45 = true;
      local_320 = uVar40;
      if (pLVar41 != pLVar5) {
        local_228._0_4_ = local_364 * local_364;
        do {
          uVar40 = (pLVar41->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits;
          auVar46 = ZEXT816(0) << 0x40;
          auVar49 = ZEXT816(0) << 0x40;
          if (0x6ffffffffffff < uVar40) {
            this_01 = (ImageInfiniteLight *)(uVar40 & 0xffffffffffff);
            if (uVar40 >> 0x30 == 8) {
              auVar71 = ZEXT856(0);
              auVar80 = ZEXT856(0);
              SVar83 = ImageInfiniteLight::Le(this_01,&ray->super_Ray,lambda);
              auVar82._0_8_ = SVar83.values.values._8_8_;
              auVar82._8_56_ = auVar80;
              auVar49 = auVar82._0_16_;
              auVar69._0_8_ = SVar83.values.values._0_8_;
              auVar69._8_56_ = auVar71;
              auVar46 = auVar69._0_16_;
            }
            else if ((short)(uVar40 >> 0x30) == 7) {
              auVar71 = ZEXT856(0);
              auVar80 = ZEXT856(0);
              SVar83 = UniformInfiniteLight::Le
                                 ((UniformInfiniteLight *)this_01,&ray->super_Ray,lambda);
              auVar77._0_8_ = SVar83.values.values._8_8_;
              auVar77._8_56_ = auVar80;
              auVar49 = auVar77._0_16_;
              auVar66._0_8_ = SVar83.values.values._0_8_;
              auVar66._8_56_ = auVar71;
              auVar46 = auVar66._0_16_;
            }
            else {
              auVar71 = ZEXT856(0);
              auVar80 = ZEXT856(0);
              SVar83 = PortalImageInfiniteLight::Le
                                 ((PortalImageInfiniteLight *)this_01,&ray->super_Ray,lambda);
              auVar78._0_8_ = SVar83.values.values._8_8_;
              auVar78._8_56_ = auVar80;
              auVar49 = auVar78._0_16_;
              auVar67._0_8_ = SVar83.values.values._0_8_;
              auVar67._8_56_ = auVar71;
              auVar46 = auVar67._0_16_;
            }
          }
          auVar46 = vmovlhps_avx(auVar46,auVar49);
          if (uVar34 == 0 || local_37c != 0) {
            auVar49._0_4_ = auVar46._0_4_ * (float)local_318._0_4_;
            auVar49._4_4_ = auVar46._4_4_ * (float)local_318._4_4_;
            auVar49._8_4_ = auVar46._8_4_ * fStack_310;
            auVar49._12_4_ = auVar46._12_4_ * fStack_30c;
          }
          else {
            uVar6 = (pLVar41->
                    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                    ).bits;
            uVar40 = (this->lightSampler).
                     super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                     .bits;
            pEVar44 = (ExhaustiveLightSampler *)(uVar40 & 0xffffffffffff);
            sVar12 = (short)(uVar40 >> 0x30);
            local_2b8 = SUB84(uVar6,0);
            afStack_2b4[0] = (float)(uVar6 >> 0x20);
            _local_358 = auVar46;
            if (uVar40 < 0x3000000000000) {
              if (sVar12 == 2) {
                local_338._0_4_ =
                     PowerLightSampler::PDF
                               ((PowerLightSampler *)pEVar44,&local_258,(LightHandle *)local_2b8);
                local_338._4_4_ = extraout_XMM0_Db;
                local_338._8_4_ = extraout_XMM0_Dc;
                local_338._12_4_ = extraout_XMM0_Dd;
              }
              else {
                sVar7 = (pEVar44->lights).nStored;
                auVar46 = vcvtusi2ss_avx512f(in_XMM5,sVar7);
                fVar55 = 1.0 / auVar46._0_4_;
                auVar51._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar51._0_4_ = fVar55;
                auVar51._16_48_ = in_ZmmResult._16_48_;
                auVar50._4_60_ = auVar51._4_60_;
                auVar50._0_4_ = (uint)(sVar7 != 0) * (int)fVar55;
                local_338 = auVar50._0_16_;
              }
            }
            else if (sVar12 == 3) {
              local_338._0_4_ =
                   BVHLightSampler::PDF
                             ((BVHLightSampler *)pEVar44,&local_258,(LightHandle *)local_2b8);
              local_338._4_4_ = extraout_XMM0_Db_00;
              local_338._8_4_ = extraout_XMM0_Dc_00;
              local_338._12_4_ = extraout_XMM0_Dd_00;
            }
            else {
              local_338._0_4_ =
                   ExhaustiveLightSampler::PDF(pEVar44,&local_258,(LightHandle *)local_2b8);
              local_338._4_4_ = extraout_XMM0_Db_01;
              local_338._8_4_ = extraout_XMM0_Dc_01;
              local_338._12_4_ = extraout_XMM0_Dd_01;
            }
            afStack_2b4[7] = local_258.n.super_Tuple3<pbrt::Normal3,_float>.z;
            afStack_2b4[8] = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.x;
            afStack_2b4[9] = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.y;
            fStack_28c = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.z;
            local_2b8 = (undefined1  [4])
                        local_258.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
            afStack_2b4[0] =
                 local_258.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
            afStack_2b4[1] =
                 local_258.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
            afStack_2b4[2] =
                 local_258.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
            afStack_2b4[3] =
                 local_258.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
            afStack_2b4[4] =
                 local_258.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
            afStack_2b4[5] = local_258.n.super_Tuple3<pbrt::Normal3,_float>.x;
            afStack_2b4[6] = local_258.n.super_Tuple3<pbrt::Normal3,_float>.y;
            pVVar2 = &(ray->super_Ray).d;
            local_2e8 = pVVar2->super_Tuple3<pbrt::Vector3,_float>;
            local_340 = local_340 & 0xffffffff00000000;
            local_1c0._0_8_ = local_2b8;
            local_1c0._8_8_ = &local_2e8;
            local_1b0 = &local_340;
            uVar40 = (pLVar41->
                     super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                     ).bits;
            uVar38 = (uint)(ushort)(uVar40 >> 0x30);
            if (uVar40 < 0x5000000000000) {
              fVar55 = 0.0;
              if (0x2ffffffffffff < uVar40) {
                if (uVar38 == 3) {
                  auVar25._8_4_ = local_258.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  auVar25._12_4_ = local_258.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  auVar25._0_4_ =
                       local_258.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
                  auVar25._4_4_ =
                       local_258.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
                  auVar25._16_4_ = local_258.n.super_Tuple3<pbrt::Normal3,_float>.z;
                  auVar25._20_4_ = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.x;
                  auVar25._24_4_ = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.y;
                  auVar25._28_4_ = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.z;
                  LVar13.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  y = local_258.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                  LVar13.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  x = local_258.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                  LVar13.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  z = local_258.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                  LVar13.n.super_Tuple3<pbrt::Normal3,_float>.x =
                       local_258.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  LVar13.n.super_Tuple3<pbrt::Normal3,_float>.y =
                       local_258.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  auVar84 = SUB1612(auVar25._16_16_,4);
                  LVar13.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar25._16_16_,0);
                  LVar13.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar84._0_4_;
                  LVar13.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar84._4_4_;
                  LVar13.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar84._8_4_;
                  fVar55 = ProjectionLight::PDF_Li
                                     ((ProjectionLight *)(uVar40 & 0xffffffffffff),LVar13,
                                      (Vector3f)pVVar2->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
                }
                else {
                  auVar26._8_4_ = local_258.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  auVar26._12_4_ = local_258.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  auVar26._0_4_ =
                       local_258.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
                  auVar26._4_4_ =
                       local_258.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
                  auVar26._16_4_ = local_258.n.super_Tuple3<pbrt::Normal3,_float>.z;
                  auVar26._20_4_ = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.x;
                  auVar26._24_4_ = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.y;
                  auVar26._28_4_ = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.z;
                  LVar14.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  y = local_258.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                  LVar14.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  x = local_258.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                  LVar14.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  z = local_258.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                  LVar14.n.super_Tuple3<pbrt::Normal3,_float>.x =
                       local_258.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  LVar14.n.super_Tuple3<pbrt::Normal3,_float>.y =
                       local_258.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  auVar84 = SUB1612(auVar26._16_16_,4);
                  LVar14.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar26._16_16_,0);
                  LVar14.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar84._0_4_;
                  LVar14.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar84._4_4_;
                  LVar14.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar84._8_4_;
                  fVar55 = GoniometricLight::PDF_Li
                                     ((GoniometricLight *)(uVar40 & 0xffffffffffff),LVar14,
                                      (Vector3f)pVVar2->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
                }
              }
            }
            else {
              _local_1f8 = uVar40;
              fVar55 = DispatchSplit<5>::operator()
                                 ((DispatchSplit<5> *)&local_360,local_1f8,uVar38 - 4);
            }
            fVar55 = (float)local_228._0_4_ /
                     ((float)local_228._0_4_ +
                     fVar55 * (float)local_338._0_4_ * fVar55 * (float)local_338._0_4_);
            auVar49._0_4_ = fVar55 * (float)local_318._0_4_ * (float)local_358._0_4_;
            auVar49._4_4_ = fVar55 * (float)local_318._4_4_ * (float)local_358._4_4_;
            auVar49._8_4_ = fVar55 * fStack_310 * fStack_350;
            auVar49._12_4_ = fVar55 * fStack_30c * fStack_34c;
          }
          auVar46 = *(undefined1 (*) [16])(lambda->pdf).values;
          uVar40 = vcmpps_avx512vl(auVar46,_DAT_00453010,4);
          auVar46 = vdivps_avx512vl(auVar49,auVar46);
          fVar55 = (float)((uint)((byte)uVar40 & 1) * auVar46._0_4_);
          fVar72 = (float)((uint)((byte)(uVar40 >> 1) & 1) * auVar46._4_4_);
          in_ZmmResult._4_4_ = fVar72;
          in_ZmmResult._0_4_ = fVar55;
          fVar81 = (float)((uint)((byte)(uVar40 >> 2) & 1) * auVar46._8_4_);
          in_ZmmResult._8_4_ = fVar81;
          fVar1 = (float)((uint)((byte)(uVar40 >> 3) & 1) * auVar46._12_4_);
          in_ZmmResult._12_4_ = fVar1;
          local_308._0_4_ = fVar55 + (float)local_308._0_4_;
          local_308._4_4_ = fVar72 + (float)local_308._4_4_;
          fStack_300 = fVar81 + fStack_300;
          fStack_2fc = fVar1 + fStack_2fc;
          pLVar41 = pLVar41 + 1;
        } while (pLVar41 != pLVar5);
        bVar45 = true;
        uVar40 = local_320;
        sampler = local_2f0;
      }
    }
    else {
      auVar74._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar74._4_4_ = 0x80000000;
      auVar74._8_4_ = 0x80000000;
      auVar74._12_4_ = 0x80000000;
      uVar36._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar36._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar46._0_8_ = uVar36 ^ 0x8000000080000000;
      auVar46._8_4_ = 0x80000000;
      auVar46._12_4_ = 0x80000000;
      w.super_Tuple3<pbrt::Vector3,_float>.z = auVar74._0_4_;
      w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar46._0_8_;
      w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar46._0_8_ >> 0x20);
      auVar80 = ZEXT856(auVar74._8_8_);
      auVar71 = ZEXT856(auVar46._8_8_);
      SVar83 = SurfaceInteraction::Le((SurfaceInteraction *)&local_138.__align,w,lambda);
      auVar69 = local_138._192_64_;
      auVar76._0_8_ = SVar83.values.values._8_8_;
      auVar76._8_56_ = auVar80;
      auVar65._0_8_ = SVar83.values.values._0_8_;
      auVar65._8_56_ = auVar71;
      uVar36 = auVar80._0_8_;
      _local_1f8 = vmovlhps_avx(auVar65._0_16_,auVar76._0_16_);
      if (((float)local_1f8 != 0.0) || (NAN((float)local_1f8))) {
LAB_003cdb09:
        if ((uVar34 == 0) || (local_37c != 0)) {
          auVar57._0_4_ = (float)local_318._0_4_ * (float)local_1f8;
          auVar57._4_4_ = (float)local_318._4_4_ * afStack_1f4[0];
          auVar57._8_4_ = fStack_310 * afStack_1f4[1];
          auVar57._12_4_ = fStack_30c * afStack_1f4[2];
          auVar46 = *(undefined1 (*) [16])(lambda->pdf).values;
          uVar36 = vcmpps_avx512vl(auVar46,_DAT_00453010,4);
          auVar46 = vdivps_avx512vl(auVar57,auVar46);
          fVar55 = (float)((uint)((byte)uVar36 & 1) * auVar46._0_4_);
          fVar72 = (float)((uint)((byte)(uVar36 >> 1) & 1) * auVar46._4_4_);
          auVar47._4_4_ = fVar72;
          auVar47._0_4_ = fVar55;
          fVar81 = (float)((uint)((byte)(uVar36 >> 2) & 1) * auVar46._8_4_);
          auVar47._8_4_ = fVar81;
          fVar1 = (float)((uint)((byte)(uVar36 >> 3) & 1) * auVar46._12_4_);
          auVar47._12_4_ = fVar1;
          uVar42 = auVar47._8_8_;
          in_ZmmResult._0_16_ = auVar47;
          local_308._0_4_ = fVar55 + (float)local_308._0_4_;
          local_308._4_4_ = fVar72 + (float)local_308._4_4_;
          fStack_300 = fVar81 + fStack_300;
          fStack_2fc = fVar1 + fStack_2fc;
          uVar36 = local_308._8_8_;
        }
        else {
          if ((char)local_38 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
          }
          uVar32 = local_138._200_8_;
          uVar36 = (this->lightSampler).
                   super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                   .bits;
          pEVar44 = (ExhaustiveLightSampler *)(uVar36 & 0xffffffffffff);
          sVar12 = (short)(uVar36 >> 0x30);
          local_2b8 = local_138._200_4_;
          afStack_2b4[0] = local_138._204_4_;
          if (uVar36 < 0x3000000000000) {
            if (sVar12 == 2) {
              local_358._0_4_ =
                   PowerLightSampler::PDF
                             ((PowerLightSampler *)pEVar44,&local_258,(LightHandle *)local_2b8);
              local_358._4_4_ = extraout_XMM0_Db_02;
              fStack_350 = (float)extraout_XMM0_Dc_02;
              fStack_34c = (float)extraout_XMM0_Dd_02;
            }
            else {
              sVar7 = (pEVar44->lights).nStored;
              auVar46 = vcvtusi2ss_avx512f(in_XMM5,sVar7);
              fVar55 = 1.0 / auVar46._0_4_;
              auVar53._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar53._0_4_ = fVar55;
              auVar53._16_48_ = in_ZmmResult._16_48_;
              auVar52._4_60_ = auVar53._4_60_;
              auVar52._0_4_ = (uint)(sVar7 != 0) * (int)fVar55;
              _local_358 = auVar52._0_16_;
            }
          }
          else if (sVar12 == 3) {
            local_358._0_4_ =
                 BVHLightSampler::PDF
                           ((BVHLightSampler *)pEVar44,&local_258,(LightHandle *)local_2b8);
            local_358._4_4_ = extraout_XMM0_Db_03;
            fStack_350 = (float)extraout_XMM0_Dc_03;
            fStack_34c = (float)extraout_XMM0_Dd_03;
          }
          else {
            local_358._0_4_ =
                 ExhaustiveLightSampler::PDF(pEVar44,&local_258,(LightHandle *)local_2b8);
            local_358._4_4_ = extraout_XMM0_Db_04;
            fStack_350 = (float)extraout_XMM0_Dc_04;
            fStack_34c = (float)extraout_XMM0_Dd_04;
          }
          afStack_2b4[7] = local_258.n.super_Tuple3<pbrt::Normal3,_float>.z;
          afStack_2b4[8] = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.x;
          afStack_2b4[9] = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.y;
          fStack_28c = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.z;
          local_2b8 = (undefined1  [4])
                      local_258.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
          afStack_2b4[0] =
               local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               x.high;
          afStack_2b4[1] =
               local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               y.low;
          afStack_2b4[2] =
               local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               y.high;
          afStack_2b4[3] =
               local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               z.low;
          afStack_2b4[4] =
               local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               z.high;
          afStack_2b4[5] = local_258.n.super_Tuple3<pbrt::Normal3,_float>.x;
          afStack_2b4[6] = local_258.n.super_Tuple3<pbrt::Normal3,_float>.y;
          pVVar2 = &(ray->super_Ray).d;
          local_2e8 = pVVar2->super_Tuple3<pbrt::Vector3,_float>;
          local_360._0_4_ = 0;
          local_1c0._0_8_ = local_2b8;
          local_1c0._8_8_ = &local_2e8;
          local_1b0 = &local_360;
          if ((ulong)uVar32 < 0x5000000000000) {
            fVar55 = 0.0;
            if (0x2ffffffffffff < (ulong)uVar32) {
              if (auVar69._14_2_ == 3) {
                auVar27._8_4_ = local_258.n.super_Tuple3<pbrt::Normal3,_float>.x;
                auVar27._12_4_ = local_258.n.super_Tuple3<pbrt::Normal3,_float>.y;
                auVar27._0_4_ =
                     local_258.pi.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
                auVar27._4_4_ =
                     local_258.pi.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
                auVar27._16_4_ = local_258.n.super_Tuple3<pbrt::Normal3,_float>.z;
                auVar27._20_4_ = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.x;
                auVar27._24_4_ = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.y;
                auVar27._28_4_ = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.z;
                LVar15.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                     = local_258.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                LVar15.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                     = local_258.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                LVar15.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                     = local_258.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                LVar15.n.super_Tuple3<pbrt::Normal3,_float>.x =
                     local_258.n.super_Tuple3<pbrt::Normal3,_float>.x;
                LVar15.n.super_Tuple3<pbrt::Normal3,_float>.y =
                     local_258.n.super_Tuple3<pbrt::Normal3,_float>.y;
                auVar84 = SUB1612(auVar27._16_16_,4);
                LVar15.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar27._16_16_,0);
                LVar15.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar84._0_4_;
                LVar15.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar84._4_4_;
                LVar15.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar84._8_4_;
                fVar55 = ProjectionLight::PDF_Li
                                   ((ProjectionLight *)(uVar32 & 0xffffffffffff),LVar15,
                                    (Vector3f)pVVar2->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
              }
              else {
                auVar28._8_4_ = local_258.n.super_Tuple3<pbrt::Normal3,_float>.x;
                auVar28._12_4_ = local_258.n.super_Tuple3<pbrt::Normal3,_float>.y;
                auVar28._0_4_ =
                     local_258.pi.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
                auVar28._4_4_ =
                     local_258.pi.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
                auVar28._16_4_ = local_258.n.super_Tuple3<pbrt::Normal3,_float>.z;
                auVar28._20_4_ = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.x;
                auVar28._24_4_ = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.y;
                auVar28._28_4_ = local_258.ns.super_Tuple3<pbrt::Normal3,_float>.z;
                LVar16.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                     = local_258.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                LVar16.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                     = local_258.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                LVar16.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                     = local_258.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                LVar16.n.super_Tuple3<pbrt::Normal3,_float>.x =
                     local_258.n.super_Tuple3<pbrt::Normal3,_float>.x;
                LVar16.n.super_Tuple3<pbrt::Normal3,_float>.y =
                     local_258.n.super_Tuple3<pbrt::Normal3,_float>.y;
                auVar84 = SUB1612(auVar28._16_16_,4);
                LVar16.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar28._16_16_,0);
                LVar16.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar84._0_4_;
                LVar16.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar84._4_4_;
                LVar16.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar84._8_4_;
                fVar55 = GoniometricLight::PDF_Li
                                   ((GoniometricLight *)(uVar32 & 0xffffffffffff),LVar16,
                                    (Vector3f)pVVar2->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
              }
            }
          }
          else {
            local_340 = uVar32;
            fVar55 = DispatchSplit<5>::operator()
                               ((DispatchSplit<5> *)((long)&local_360 + 7),&local_340,
                                auVar69._14_2_ - 4);
          }
          fVar55 = (local_364 * local_364) /
                   (local_364 * local_364 +
                   fVar55 * (float)local_358._0_4_ * fVar55 * (float)local_358._0_4_);
          auVar58._0_4_ = fVar55 * (float)local_318._0_4_ * (float)local_1f8;
          auVar58._4_4_ = fVar55 * (float)local_318._4_4_ * afStack_1f4[0];
          auVar58._8_4_ = fVar55 * fStack_310 * afStack_1f4[1];
          auVar58._12_4_ = fVar55 * fStack_30c * afStack_1f4[2];
          auVar46 = *(undefined1 (*) [16])(lambda->pdf).values;
          uVar36 = vcmpps_avx512vl(auVar46,_DAT_00453010,4);
          auVar46 = vdivps_avx512vl(auVar58,auVar46);
          fVar55 = (float)((uint)((byte)uVar36 & 1) * auVar46._0_4_);
          fVar72 = (float)((uint)((byte)(uVar36 >> 1) & 1) * auVar46._4_4_);
          auVar48._4_4_ = fVar72;
          auVar48._0_4_ = fVar55;
          fVar81 = (float)((uint)((byte)(uVar36 >> 2) & 1) * auVar46._8_4_);
          auVar48._8_4_ = fVar81;
          fVar1 = (float)((uint)((byte)(uVar36 >> 3) & 1) * auVar46._12_4_);
          auVar48._12_4_ = fVar1;
          uVar42 = auVar48._8_8_;
          in_ZmmResult._0_16_ = auVar48;
          local_308._0_4_ = fVar55 + (float)local_308._0_4_;
          local_308._4_4_ = fVar72 + (float)local_308._4_4_;
          fStack_300 = fVar81 + fStack_300;
          fStack_2fc = fVar1 + fStack_2fc;
          uVar36 = local_308._8_8_;
          sampler = local_2f0;
        }
      }
      else {
        uVar42 = 0;
        while (uVar35 = uVar42, uVar35 != 3) {
          if ((*(float *)(local_1f8 + uVar35 * 4 + 4) != 0.0) ||
             (uVar42 = uVar35 + 1, NAN(*(float *)(local_1f8 + uVar35 * 4 + 4)))) break;
        }
        uVar42 = 0;
        if (uVar35 < 3) goto LAB_003cdb09;
      }
      if ((char)local_38 == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
      }
      local_1c8.bits =
           (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           .bits;
      local_1d0.bits =
           (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
      SurfaceInteraction::GetBSDF
                ((BSDF *)local_1c0,(SurfaceInteraction *)&local_138.__align,ray,lambda,
                 (CameraHandle *)&local_1c8,local_158,(SamplerHandle *)&local_1d0);
      if ((local_1c0._0_8_ & 0xffffffffffff) == 0) {
        if ((char)local_38 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
        }
        SurfaceInteraction::SkipIntersection
                  ((SurfaceInteraction *)&local_138.__align,ray,(Float)local_138._248_4_);
        bVar45 = false;
      }
      else {
        if (uVar34 == 0 && local_1e0 != (VisibleSurface *)0x0) {
          _local_358 = ZEXT816(0);
          uVar42 = 0;
          do {
            uVar42 = uVar42 + 1;
            fVar55 = 1.0;
            lVar43 = 0;
            uVar36 = uVar42;
            do {
              lVar43 = (lVar43 - uVar36 / 2) * 2 + uVar36;
              fVar55 = local_1fc * fVar55;
              bVar45 = 1 < uVar36;
              uVar36 = uVar36 / 2;
            } while (bVar45);
            auVar46 = vcvtusi2ss_avx512f(in_XMM5,lVar43);
            fVar72 = 1.0;
            lVar43 = 0;
            uVar36 = uVar42;
            do {
              lVar43 = (lVar43 - uVar36 / 3) * 3 + uVar36;
              fVar72 = local_200 * fVar72;
              bVar45 = 2 < uVar36;
              uVar36 = uVar36 / 3;
            } while (bVar45);
            auVar49 = vcvtusi2ss_avx512f(in_XMM5,lVar43);
            fVar81 = 1.0;
            lVar43 = 0;
            uVar36 = uVar42;
            do {
              lVar43 = (lVar43 - uVar36 / 5) * 5 + uVar36;
              fVar81 = local_204 * fVar81;
              bVar45 = 4 < uVar36;
              uVar36 = uVar36 / 5;
            } while (bVar45);
            if ((char)local_38 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
            }
            auVar47 = SUB6416(ZEXT464(0x3f7fffff),0);
            auVar49 = vminss_avx(auVar47,ZEXT416((uint)(fVar72 * auVar49._0_4_)));
            auVar74 = vcvtusi2ss_avx512f(in_XMM5,lVar43);
            auVar74 = vminss_avx(auVar47,ZEXT416((uint)(fVar81 * auVar74._0_4_)));
            auVar49 = vinsertps_avx(auVar49,auVar74,0x10);
            auVar46 = vminss_avx(auVar47,ZEXT416((uint)(fVar55 * auVar46._0_4_)));
            uVar36 = 0;
            BSDF::Sample_f((optional<pbrt::BSDFSample> *)local_2b8,(BSDF *)local_1c0,
                           (Vector3f)local_138._28_12_,auVar46._0_4_,(Point2f)auVar49._0_8_,Radiance
                           ,All);
            if (fStack_28c._0_1_ == true) {
              if ((char)local_38 == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
              }
              auVar46 = vfmadd132ss_fma(ZEXT416((uint)local_138._132_4_),
                                        ZEXT416((uint)((float)local_138._136_4_ * afStack_2b4[5])),
                                        ZEXT416((uint)afStack_2b4[4]));
              auVar49 = vfmsub213ss_fma(ZEXT416((uint)afStack_2b4[5]),
                                        ZEXT416((uint)local_138._136_4_),
                                        ZEXT416((uint)((float)local_138._136_4_ * afStack_2b4[5])));
              auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ + auVar49._0_4_)),
                                        ZEXT416((uint)local_138._128_4_),
                                        ZEXT416((uint)afStack_2b4[3]));
              uVar73 = auVar46._0_4_;
              auVar59._4_4_ = uVar73;
              auVar59._0_4_ = uVar73;
              auVar59._8_4_ = uVar73;
              auVar59._12_4_ = uVar73;
              auVar8._8_4_ = 0x7fffffff;
              auVar8._0_8_ = 0x7fffffff7fffffff;
              auVar8._12_4_ = 0x7fffffff;
              auVar46 = vandps_avx512vl(auVar59,auVar8);
              auVar60._0_4_ = auVar46._0_4_ * (float)local_2b8;
              auVar60._4_4_ = auVar46._4_4_ * afStack_2b4[0];
              auVar60._8_4_ = auVar46._8_4_ * afStack_2b4[1];
              auVar60._12_4_ = auVar46._12_4_ * afStack_2b4[2];
              auVar9._4_4_ = afStack_2b4[6];
              auVar9._0_4_ = afStack_2b4[6];
              auVar9._8_4_ = afStack_2b4[6];
              auVar9._12_4_ = afStack_2b4[6];
              auVar46 = vdivps_avx512vl(auVar60,auVar9);
              local_358._0_4_ = auVar46._0_4_ + (float)local_358._0_4_;
              local_358._4_4_ = auVar46._4_4_ + (float)local_358._4_4_;
              fStack_350 = auVar46._8_4_ + fStack_350;
              fStack_34c = auVar46._12_4_ + fStack_34c;
              uVar36 = local_358._8_8_;
              fStack_28c = (float)((uint)fStack_28c & 0xffffff00);
            }
          } while (uVar42 != 0x10);
          auVar10._8_4_ = 0x3d800000;
          auVar10._0_8_ = 0x3d8000003d800000;
          auVar10._12_4_ = 0x3d800000;
          _local_2e8 = vmulps_avx512vl(_local_358,auVar10);
          if ((char)local_38 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
          }
          VisibleSurface::VisibleSurface
                    ((VisibleSurface *)local_2b8,(SurfaceInteraction *)&local_138.__align,
                     (CameraTransform *)
                     ((this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      .bits & 0xffffffffffff),
                     (SampledSpectrum *)
                     &((aligned_storage_t<sizeof(pbrt::BSDFSample),_alignof(pbrt::BSDFSample)> *)
                      &local_2e8)->__align,lambda);
          (local_1e0->albedo).values.values[3] = fStack_278;
          auVar24._4_4_ = afStack_2b4[0];
          auVar24._0_4_ = local_2b8;
          auVar24._8_4_ = afStack_2b4[1];
          auVar24._12_4_ = afStack_2b4[2];
          uVar18 = afStack_2b4[3];
          auVar17 = auVar24;
          auVar85._16_4_ = uVar18;
          auVar85._0_16_ = auVar17;
          uVar19 = afStack_2b4[4];
          auVar85._20_4_ = uVar19;
          uVar20 = afStack_2b4[5];
          auVar85._24_4_ = uVar20;
          uVar21 = afStack_2b4[6];
          in_ZmmResult._28_4_ = uVar21;
          in_ZmmResult._0_28_ = auVar85;
          uVar22 = afStack_2b4[7];
          in_ZmmResult._32_4_ = uVar22;
          uVar23 = afStack_2b4[8];
          in_ZmmResult._36_4_ = uVar23;
          in_ZmmResult._40_4_ = afStack_2b4[9];
          in_ZmmResult._44_4_ = fStack_28c;
          in_ZmmResult._48_4_ = fStack_288;
          in_ZmmResult._52_4_ = fStack_284;
          in_ZmmResult._56_4_ = fStack_280;
          in_ZmmResult._60_4_ = fStack_27c;
          uVar42 = auVar24._8_8_;
          local_1e0->set = (bool)local_2b8[0];
          *(int3 *)&local_1e0->field_0x1 = local_2b8._1_3_;
          local_1e0->p = (Point3f)auVar24._4_12_;
          local_1e0->n = (Normal3f)auVar85._16_12_;
          local_1e0->ns = (Normal3f)in_ZmmResult._28_12_;
          local_1e0->time = afStack_2b4[9];
          local_1e0->dzdx = fStack_28c;
          local_1e0->dzdy = fStack_288;
          (local_1e0->albedo).values.values[0] = fStack_284;
          (local_1e0->albedo).values.values[1] = fStack_280;
          (local_1e0->albedo).values.values[2] = fStack_27c;
          sampler = local_2f0;
        }
        local_358._0_4_ = uVar34 + 1;
        bVar45 = true;
        if (uVar34 != this->maxDepth) {
          if ((this->regularize == true) && ((local_210 & 1) != 0)) {
            *(long *)(in_FS_OFFSET + -0x288) = *(long *)(in_FS_OFFSET + -0x288) + 1;
            BSDF::Regularize((BSDF *)local_1c0);
          }
          *(long *)(in_FS_OFFSET + -0x280) = *(long *)(in_FS_OFFSET + -0x280) + 1;
          sVar12 = SUB82(local_1c0._0_8_,6);
          if (SUB84(local_1c0._0_8_,4) >> 0x11 < 3) {
            if ((ulong)local_1c0._0_8_ < (undefined1 *)0x3000000000000) {
              this_02 = (DiffuseBxDF *)(local_1c0._0_8_ & 0xffffffffffff);
              if (sVar12 == 2) {
                BVar33 = DiffuseBxDF::Flags(this_02);
              }
              else {
                fVar55 = (this_02->R).values.values[0];
                uVar42 = 0;
                BVar33 = DiffuseReflection;
                if ((fVar55 == 0.0) && (!NAN(fVar55))) {
                  uVar35 = 0xffffffffffffffff;
                  while (uVar35 != 2) {
                    fVar55 = (this_02->R).values.values[uVar35 + 2];
                    uVar35 = uVar35 + 1;
                    if ((fVar55 != 0.0) || (NAN(fVar55))) goto LAB_003ce69e;
                  }
                  uVar35 = 3;
LAB_003ce69e:
                  uVar42 = 0;
                  BVar33 = (uint)(uVar35 < 3) * 5;
                }
              }
            }
            else {
              this_03 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                        (local_1c0._0_8_ & 0xffffffffffff);
              if (sVar12 == 4) {
                BVar33 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                   (this_03);
              }
              else if (sVar12 == 3) {
                BVar33 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                                   ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                     *)this_03);
              }
              else {
                auVar46 = vminss_avx(ZEXT416((uint)(this_03->top).mfDistrib.alpha_y),
                                     ZEXT416((uint)(this_03->top).mfDistrib.alpha_x));
                uVar42 = auVar46._8_8_;
                uVar36 = 0;
                BVar33 = (uint)(auVar46._0_4_ < 0.001) * 8 + (GlossyTransmission|Reflection);
              }
            }
          }
          else if ((ulong)local_1c0._0_8_ >> 0x33 == 0) {
            BVar33 = Unset;
            if (sVar12 == 7) {
              BVar33 = GlossyReflection;
            }
          }
          else if ((ulong)local_1c0._0_8_ >> 0x30 == 8) {
            BVar33 = GlossyReflection;
          }
          else if (sVar12 == 9) {
            auVar46 = vminss_avx(ZEXT416(((uint *)(local_1c0._0_8_ & 0xffffffffffff))[1]),
                                 ZEXT416(*(uint *)(local_1c0._0_8_ & 0xffffffffffff)));
            uVar42 = auVar46._8_8_;
            uVar36 = 0;
            BVar33 = (uint)(auVar46._0_4_ < 0.001) * 8 + GlossyReflection;
          }
          else {
            BVar33 = DiffuseReflection;
          }
          if ((BVar33 & (Glossy|Diffuse)) != Unset) {
            *(long *)(in_FS_OFFSET + -0x278) = *(long *)(in_FS_OFFSET + -0x278) + 1;
            local_1d8.
            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     )(sampler->
                      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits;
            auVar71 = ZEXT856(uVar42);
            auVar80 = ZEXT856(uVar36);
            SVar83 = SampleLd(this,(SurfaceInteraction *)&local_138.__align,(BSDF *)local_1c0,lambda
                              ,&local_1d8);
            auVar79._0_8_ = SVar83.values.values._8_8_;
            auVar79._8_56_ = auVar80;
            auVar68._0_8_ = SVar83.values.values._0_8_;
            auVar68._8_56_ = auVar71;
            auVar46 = vmovlhps_avx(auVar68._0_16_,auVar79._0_16_);
            local_2b8 = auVar46._0_4_;
            afStack_2b4[0] = auVar46._4_4_;
            afStack_2b4[1] = auVar46._8_4_;
            afStack_2b4[2] = auVar46._12_4_;
            if (((float)local_2b8 == 0.0) && (!NAN((float)local_2b8))) {
              uVar36 = 0;
              while (uVar42 = uVar36, uVar42 != 3) {
                if ((afStack_2b4[uVar42] != 0.0) || (uVar36 = uVar42 + 1, NAN(afStack_2b4[uVar42])))
                break;
              }
              if (2 < uVar42) {
                *(long *)(in_FS_OFFSET + -0x270) = *(long *)(in_FS_OFFSET + -0x270) + 1;
              }
            }
            auVar61._0_4_ = (float)local_318._0_4_ * (float)local_2b8;
            auVar61._4_4_ = (float)local_318._4_4_ * afStack_2b4[0];
            auVar61._8_4_ = fStack_310 * afStack_2b4[1];
            auVar61._12_4_ = fStack_30c * afStack_2b4[2];
            auVar46 = *(undefined1 (*) [16])(lambda->pdf).values;
            uVar36 = vcmpps_avx512vl(auVar46,_DAT_00453010,4);
            auVar46 = vdivps_avx512vl(auVar61,auVar46);
            fVar55 = (float)((uint)((byte)uVar36 & 1) * auVar46._0_4_);
            fVar72 = (float)((uint)((byte)(uVar36 >> 1) & 1) * auVar46._4_4_);
            in_ZmmResult._4_4_ = fVar72;
            in_ZmmResult._0_4_ = fVar55;
            fVar81 = (float)((uint)((byte)(uVar36 >> 2) & 1) * auVar46._8_4_);
            in_ZmmResult._8_4_ = fVar81;
            fVar1 = (float)((uint)((byte)(uVar36 >> 3) & 1) * auVar46._12_4_);
            in_ZmmResult._12_4_ = fVar1;
            local_308._4_4_ = fVar72 + (float)local_308._4_4_;
            local_308._0_4_ = fVar55 + (float)local_308._0_4_;
            fStack_300 = fVar81 + fStack_300;
            fStack_2fc = fVar1 + fStack_2fc;
          }
          uVar3 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar4 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          local_338._4_4_ = uVar4;
          local_338._0_4_ = uVar3;
          local_338._8_8_ = 0;
          local_228 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          uVar36 = (sampler->
                   super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
          local_2b8 = SUB84(uVar36,0);
          afStack_2b4[0] = (float)(uVar36 >> 0x20);
          local_320 = uVar40;
          local_178 = DispatchSplit<9>::operator()
                                ((DispatchSplit<9> *)&local_2e8,local_2b8,uVar36 >> 0x30);
          uVar40 = (sampler->
                   super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
          this_00 = (DebugMLTSampler *)(uVar40 & 0xffffffffffff);
          sVar12 = (short)(uVar40 >> 0x30);
          if (uVar40 < 0x5000000000000) {
            if (uVar40 < 0x3000000000000) {
              if (sVar12 == 2) {
                u2 = (Tuple2<pbrt::Point2,_float>)
                     StratifiedSampler::Get2D((StratifiedSampler *)this_00);
              }
              else {
                u2 = (Tuple2<pbrt::Point2,_float>)RandomSampler::Get2D((RandomSampler *)this_00);
              }
            }
            else if (sVar12 == 3) {
              u2 = (Tuple2<pbrt::Point2,_float>)HaltonSampler::Get2D((HaltonSampler *)this_00);
            }
            else {
              u2 = (Tuple2<pbrt::Point2,_float>)
                   PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_00);
            }
          }
          else if (uVar40 < 0x7000000000000) {
            if (sVar12 == 6) {
              u2 = (Tuple2<pbrt::Point2,_float>)ZSobolSampler::Get2D((ZSobolSampler *)this_00);
            }
            else {
              u2 = (Tuple2<pbrt::Point2,_float>)SobolSampler::Get2D((SobolSampler *)this_00);
            }
          }
          else if (uVar40 >> 0x30 == 8) {
            u2 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)this_00);
          }
          else if (sVar12 == 7) {
            u2 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_00);
          }
          else {
            local_188 = DebugMLTSampler::Get1D(this_00);
            FStack_184 = extraout_XMM0_Db_05;
            FStack_180 = extraout_XMM0_Dc_05;
            FStack_17c = extraout_XMM0_Dd_05;
            auVar70._0_4_ = DebugMLTSampler::Get1D(this_00);
            auVar70._4_60_ = extraout_var;
            auVar30._4_4_ = FStack_184;
            auVar30._0_4_ = local_188;
            auVar30._8_4_ = FStack_180;
            auVar30._12_4_ = FStack_17c;
            auVar46 = vinsertps_avx(auVar30,auVar70._0_16_,0x10);
            u2 = auVar46._0_8_;
          }
          auVar62._0_8_ = local_338._0_8_ ^ 0x8000000080000000;
          auVar62._8_4_ = local_338._8_4_ ^ 0x80000000;
          auVar62._12_4_ = local_338._12_4_ ^ 0x80000000;
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = -local_228._0_4_;
          auVar75._0_8_ = local_228._0_8_ ^ 0x8000000080000000;
          auVar75._8_4_ = local_228._8_4_ ^ 0x80000000;
          auVar75._12_4_ = local_228._12_4_ ^ 0x80000000;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar62._0_8_;
          woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar62._0_8_ >> 0x20);
          local_338 = auVar62;
          local_228 = auVar75;
          BSDF::Sample_f((optional<pbrt::BSDFSample> *)
                         &((aligned_storage_t<sizeof(pbrt::BSDFSample),_alignof(pbrt::BSDFSample)> *
                           )&local_2e8)->__align,(BSDF *)local_1c0,woRender,local_178,(Point2f)u2,
                         Radiance,All);
          auVar46 = local_338;
          bVar45 = true;
          if (local_2bc != '\0') {
            auVar49 = vfmadd132ss_fma(ZEXT416((uint)local_138._132_4_),
                                      ZEXT416((uint)((float)local_138._136_4_ * (float)local_2d0)),
                                      ZEXT416((uint)uStack_2d4));
            auVar74 = vfmsub213ss_fma(ZEXT416((uint)local_2d0),ZEXT416((uint)local_138._136_4_),
                                      ZEXT416((uint)((float)local_138._136_4_ * (float)local_2d0)));
            auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar49._0_4_ + auVar74._0_4_)),
                                      ZEXT416((uint)local_138._128_4_),ZEXT416((uint)local_2d8));
            uVar73 = auVar49._0_4_;
            auVar63._4_4_ = uVar73;
            auVar63._0_4_ = uVar73;
            auVar63._8_4_ = uVar73;
            auVar63._12_4_ = uVar73;
            auVar11._8_4_ = 0x7fffffff;
            auVar11._0_8_ = 0x7fffffff7fffffff;
            auVar11._12_4_ = 0x7fffffff;
            auVar49 = vandps_avx512vl(auVar63,auVar11);
            local_178 = auVar49._0_4_ * local_2e8.x;
            fStack_174 = auVar49._4_4_ * local_2e8.y;
            fStack_170 = auVar49._8_4_ * local_2e8.z;
            fStack_16c = auVar49._12_4_ * (float)uStack_2dc;
            local_188 = (Float)local_2cc;
            FStack_184 = (Float)local_2cc;
            FStack_180 = (Float)local_2cc;
            FStack_17c = (Float)local_2cc;
            if (local_2c0 == '\x01') {
              wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_2d4;
              wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2d8;
              wiRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_2d0;
              woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_228._0_4_;
              woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_338._0_4_;
              woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_338._4_4_;
              local_338 = auVar46;
              local_364 = BSDF::PDF((BSDF *)local_1c0,woRender_00,wiRender,Radiance,All);
            }
            else {
              local_364 = (float)local_2cc;
            }
            auVar69 = local_138._0_64_;
            auVar46 = local_338;
            if (local_2bc == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
            }
            uVar34 = local_2c8 & 0x10;
            local_338._1_3_ = 0;
            local_338[0] = (local_2c8 & 2) == 0;
            local_338._4_12_ = auVar46._4_12_;
            if ((char)local_38 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
            }
            local_228._0_4_ = local_2c4;
            afStack_2b4[3] = local_138._16_4_;
            afStack_2b4[4] = local_138._20_4_;
            local_2b8 = local_138._0_4_;
            afStack_2b4[0] = local_138._4_4_;
            afStack_2b4[1] = local_138._8_4_;
            afStack_2b4[2] = local_138._12_4_;
            afStack_2b4[7] = (float)local_138._48_4_;
            afStack_2b4[5] = local_138._40_4_;
            afStack_2b4[6] = local_138._44_4_;
            fStack_28c = (float)local_138._136_4_;
            afStack_2b4[8] = local_138._128_4_;
            afStack_2b4[9] = local_138._132_4_;
            local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
                 (Interval)local_138.__align;
            local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
            low = (Float)local_138._8_4_;
            local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
            high = (Float)local_138._12_4_;
            local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
            low = (Float)local_138._16_4_;
            local_258.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
            high = (Float)local_138._20_4_;
            local_258.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_138._40_4_;
            local_258.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_138._44_4_;
            local_258.ns.super_Tuple3<pbrt::Normal3,_float>.x = afStack_2b4[8];
            local_258.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)local_138._48_4_;
            local_258.ns.super_Tuple3<pbrt::Normal3,_float>._4_8_ = local_138._132_8_;
            wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_2d4;
            wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2d8;
            wi.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_2d0;
            local_138._0_64_ = auVar69;
            SurfaceInteraction::SpawnRay
                      ((RayDifferential *)local_2b8,(SurfaceInteraction *)&local_138.__align,ray,
                       (BSDF *)local_1c0,wi,local_2c8,(Float)local_2c4);
            sampler = local_2f0;
            auVar31._4_4_ = fStack_174;
            auVar31._0_4_ = local_178;
            auVar31._8_4_ = fStack_170;
            auVar31._12_4_ = fStack_16c;
            auVar29._4_4_ = FStack_184;
            auVar29._0_4_ = local_188;
            auVar29._8_4_ = FStack_180;
            auVar29._12_4_ = FStack_17c;
            auVar46 = vdivps_avx(auVar31,auVar29);
            local_318._0_4_ = auVar46._0_4_ * (float)local_318._0_4_;
            local_318._4_4_ = auVar46._4_4_ * (float)local_318._4_4_;
            fStack_310 = auVar46._8_4_ * fStack_310;
            fStack_30c = auVar46._12_4_ * fStack_30c;
            local_37c = uVar34 >> 4;
            local_210 = CONCAT71((int7)(local_210 >> 8),(byte)local_210 | uVar34 == 0);
            fVar55 = (float)local_148._0_4_ * (float)local_228._0_4_ * (float)local_228._0_4_;
            auVar54._16_48_ = in_ZmmResult._16_48_;
            auVar54._0_16_ = ZEXT416((uint)fVar55);
            in_ZmmResult._4_60_ = auVar54._4_60_;
            in_ZmmResult._0_4_ =
                 (float)((uint)(local_338[0] & 1) * local_148._0_4_ +
                        (uint)!(bool)(local_338[0] & 1) * (int)fVar55);
            local_148 = in_ZmmResult._0_16_;
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = afStack_2b4[2];
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = afStack_2b4[3];
            *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                 CONCAT44(afStack_2b4[5],afStack_2b4[4]);
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_2b8;
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = afStack_2b4[0];
            *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                 CONCAT44(afStack_2b4[2],afStack_2b4[1]);
            (ray->super_Ray).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = CONCAT44(afStack_2b4[8],afStack_2b4[7]);
            *(ulong *)(local_160 + 0x14) = CONCAT44(fStack_278,fStack_27c);
            (((Vector3f *)(local_160 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).x = fStack_274;
            (((Vector3f *)(local_160 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).y = fStack_270;
            *(undefined8 *)(local_160 + 0x24) = uStack_26c;
            *(undefined8 *)(local_160 + 0x2c) = uStack_264;
            *(ulong *)local_160 = CONCAT44(fStack_28c,afStack_2b4[9]);
            *(undefined8 *)(local_160 + 8) = _fStack_288;
            (((Point3f *)(local_160 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x = fStack_280;
            (((Point3f *)(local_160 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y = fStack_27c;
            *(ulong *)(local_160 + 0x18) = CONCAT44(fStack_274,fStack_278);
            local_2b8 = (undefined1  [4])(in_ZmmResult._0_4_ * (float)local_318._0_4_);
            afStack_2b4[0] = in_ZmmResult._0_4_ * (float)local_318._4_4_;
            afStack_2b4[1] = in_ZmmResult._0_4_ * fStack_310;
            afStack_2b4[2] = in_ZmmResult._0_4_ * fStack_30c;
            lVar43 = 1;
            auVar82 = ZEXT464((uint)local_2b8);
            auVar69 = ZEXT464((uint)local_2b8);
            do {
              auVar46 = vmaxss_avx(ZEXT416((uint)afStack_2b4[lVar43 + -1]),auVar69._0_16_);
              auVar69 = ZEXT1664(auVar46);
              lVar43 = lVar43 + 1;
            } while (lVar43 != 4);
            cVar39 = '\0';
            if (0 < (int)local_320 && auVar46._0_4_ < 1.0) {
              lVar43 = 1;
              do {
                auVar46 = vmaxss_avx(ZEXT416((uint)afStack_2b4[lVar43 + -1]),auVar82._0_16_);
                auVar82 = ZEXT1664(auVar46);
                lVar43 = lVar43 + 1;
              } while (lVar43 != 4);
              local_338._0_4_ = auVar46._0_4_;
              local_340 = (local_2f0->
                          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                          ).bits;
              FVar56 = DispatchSplit<9>::operator()
                                 ((DispatchSplit<9> *)&local_360,&local_340,local_340 >> 0x30);
              auVar46 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_338._0_4_)),ZEXT416(0));
              fVar55 = auVar46._0_4_;
              if (fVar55 <= FVar56) {
                fVar55 = 1.0 - fVar55;
                auVar64._4_4_ = fVar55;
                auVar64._0_4_ = fVar55;
                auVar64._8_4_ = fVar55;
                auVar64._12_4_ = fVar55;
                _local_318 = vdivps_avx(_local_318,auVar64);
                cVar39 = '\0';
              }
              else {
                cVar39 = (FVar56 < fVar55) * '\x03';
              }
            }
            bVar45 = cVar39 == '\x03';
          }
          if (local_2bc == '\x01') {
            local_2bc = '\0';
          }
        }
        uVar34 = local_358._0_4_;
      }
      uVar40 = (ulong)uVar34;
    }
    if ((char)local_38 == '\x01') {
      local_38 = local_38 & 0xffffffffffffff00;
    }
    if (bVar45) {
      lVar43 = (long)(int)uVar40;
      *(long *)(in_FS_OFFSET + -0x268) = *(long *)(in_FS_OFFSET + -0x268) + lVar43;
      *(long *)(in_FS_OFFSET + -0x260) = *(long *)(in_FS_OFFSET + -0x260) + 1;
      lVar37 = *(long *)(in_FS_OFFSET + -0x640);
      if (lVar43 <= *(long *)(in_FS_OFFSET + -0x640)) {
        lVar37 = lVar43;
      }
      *(long *)(in_FS_OFFSET + -0x640) = lVar37;
      if (lVar43 < *(long *)(in_FS_OFFSET + -0x638)) {
        lVar43 = *(long *)(in_FS_OFFSET + -0x638);
      }
      *(long *)(in_FS_OFFSET + -0x638) = lVar43;
      auVar46 = vshufpd_avx(_local_308,_local_308,1);
      SVar83.values.values._0_8_ = local_308;
      SVar83.values.values._8_8_ = auVar46._0_8_;
      return (SampledSpectrum)SVar83.values.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum PathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                   SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                   VisibleSurface *visibleSurf) const {
    // Declare local variables for _PathIntegrator::Li()_
    SampledSpectrum L(0.f), beta(1.f);
    int depth = 0;

    Float bsdfPDF, etaScale = 1;
    bool specularBounce = false, anyNonSpecularBounces = false;
    LightSampleContext prevIntrCtx;

    while (true) {
        // Find next path vertex and accumulate contribution
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        // Add emitted light at path vertex or from the environment
        if (!si) {
            // Incorporate emission from infinite lights for escaped ray
            for (const auto &light : infiniteLights) {
                SampledSpectrum Le = light.Le(ray, lambda);
                if (depth == 0 || specularBounce)
                    L += SafeDiv(beta * Le, lambda.PDF());
                else {
                    // Compute MIS weight for infinite light
                    Float lightPDF =
                        lightSampler.PDF(prevIntrCtx, light) *
                        light.PDF_Li(prevIntrCtx, ray.d, LightSamplingMode::WithMIS);
                    Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                    L += SafeDiv(beta * weight * Le, lambda.PDF());
                }
            }

            break;
        }
        // Incorporate emission from emissive surface hit by ray
        SampledSpectrum Le = si->intr.Le(-ray.d, lambda);
        if (Le) {
            if (depth == 0 || specularBounce)
                L += SafeDiv(beta * Le, lambda.PDF());
            else {
                // Compute MIS weight for area light
                LightHandle areaLight(si->intr.areaLight);
                Float lightPDF =
                    lightSampler.PDF(prevIntrCtx, areaLight) *
                    areaLight.PDF_Li(prevIntrCtx, ray.d, LightSamplingMode::WithMIS);
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                L += SafeDiv(beta * weight * Le, lambda.PDF());
            }
        }

        SurfaceInteraction &isect = si->intr;
        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Initialize _visibleSurf_ at first intersection
        if (depth == 0 && visibleSurf != nullptr) {
            // Estimate BSDF's albedo
            constexpr int nRhoSamples = 16;
            SampledSpectrum rho(0.f);
            for (int i = 0; i < nRhoSamples; ++i) {
                // Generate sample for hemispherical-directional reflectance
                Float uc = RadicalInverse(0, i + 1);
                Point2f u(RadicalInverse(1, i + 1), RadicalInverse(2, i + 1));

                // Estimate one term of $\rho_\roman{hd}$
                pstd::optional<BSDFSample> bs = bsdf.Sample_f(si->intr.wo, uc, u);
                if (bs)
                    rho += bs->f * AbsDot(bs->wi, si->intr.shading.n) / bs->pdf;
            }
            SampledSpectrum albedo = rho / nRhoSamples;

            *visibleSurf =
                VisibleSurface(si->intr, camera.GetCameraTransform(), albedo, lambda);
        }

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        ++totalBSDFs;
        // Sample direct illumination from the light sources
        if (bsdf.IsNonSpecular()) {
            ++totalPaths;
            SampledSpectrum Ld = SampleLd(isect, &bsdf, lambda, sampler);
            if (!Ld)
                ++zeroRadiancePaths;
            L += SafeDiv(beta * Ld, lambda.PDF());
        }

        // Sample BSDF to get new path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        pstd::optional<BSDFSample> bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update path state variables for after surface scattering
        beta *= bs->f * AbsDot(bs->wi, isect.shading.n) / bs->pdf;
        bsdfPDF = bs->pdfIsProportional ? bsdf.PDF(wo, bs->wi) : bs->pdf;
        DCHECK(!IsInf(beta.y(lambda)));
        specularBounce = bs->IsSpecular();
        anyNonSpecularBounces |= !bs->IsSpecular();
        if (bs->IsTransmission())
            etaScale *= Sqr(bs->eta);
        prevIntrCtx = si->intr;

        ray = isect.SpawnRay(ray, bsdf, bs->wi, bs->flags, bs->eta);

        // Possibly terminate the path with Russian roulette
        SampledSpectrum rrBeta = beta * etaScale;
        if (rrBeta.MaxComponentValue() < 1 && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            beta /= 1 - q;
            DCHECK(!IsInf(beta.y(lambda)));
        }
    }
    ReportValue(pathLength, depth);
    return L;
}